

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mser.c
# Opt level: O0

void mser_process(MserFilt *f,uchar *im)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uchar uVar5;
  uchar uVar6;
  uint uVar7;
  int iVar8;
  uint *puVar9;
  uint *puVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  int *piVar14;
  MserReg *r_00;
  bool bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint local_564;
  uint local_55c;
  uint local_558;
  bool local_552;
  uint next_1;
  float div;
  int p_area;
  int area_1;
  uint parent_2;
  float min_div;
  float max_var;
  float min_area;
  float max_area;
  uint loser;
  float p_var;
  uchar p_val_1;
  float var;
  uchar val_2;
  uint parent_1;
  int curr;
  int parent;
  int area_top;
  int area;
  int next_val;
  int next;
  int top;
  int top_val;
  uint idx_2;
  int is_extr;
  uchar p_val;
  uint p_idx;
  uchar val_1;
  uint idx_1;
  int n_hgt;
  int hgt;
  uint nr_idx;
  uchar nr_val;
  int temp_1;
  int good;
  uint n_idx;
  uint temp;
  uint r_idx;
  uchar val;
  uint idx;
  uint j_1;
  uchar v_1;
  uchar v;
  uint buckets [256];
  int local_9c;
  int local_98;
  int k;
  int j;
  int i;
  int ndup;
  int nbad;
  int nsmall;
  int nbig;
  int nmer;
  int ner;
  int njoins;
  int delta;
  uint *mer;
  MserExtrReg *er;
  MserReg *r;
  int *strides;
  int *dsubs;
  int *subs;
  int *dims;
  int ndims;
  uint *joins;
  uint *perm;
  uint nel;
  uchar *im_local;
  MserFilt *f_local;
  
  uVar7 = f->nel;
  puVar9 = f->perm;
  puVar10 = f->joins;
  iVar17 = f->ndims;
  piVar11 = f->dims;
  piVar12 = f->subs;
  piVar13 = f->dsubs;
  piVar14 = f->strides;
  r_00 = f->r;
  mer = (uint *)f->er;
  _njoins = f->mer;
  iVar8 = f->delta;
  nmer = 0;
  nbig = 0;
  nbad = 0;
  ndup = 0;
  i = 0;
  j = 0;
  f->nell = 0;
  memset(&j_1,0,0x400);
  for (k = 0; k < (int)uVar7; k = k + 1) {
    (&j_1)[im[k]] = (&j_1)[im[k]] + 1;
  }
  for (k = 1; uVar18 = uVar7, k < 0x100; k = k + 1) {
    (&j_1)[k] = (&j_1)[k + -1] + (&j_1)[k];
  }
  while (k = uVar18, 0 < k) {
    uVar18 = k - 1;
    uVar16 = (&j_1)[im[(int)uVar18]];
    (&j_1)[im[(int)uVar18]] = uVar16 - 1;
    puVar9[uVar16 - 1] = uVar18;
  }
  for (k = 0; k < (int)uVar7; k = k + 1) {
    r_00[k].parent = 0xffffffff;
  }
  k = 0;
LAB_00103be5:
  if (k < (int)uVar7) {
    uVar18 = puVar9[k];
    uVar5 = im[uVar18];
    r_00[uVar18].parent = uVar18;
    r_00[uVar18].shortcut = uVar18;
    r_00[uVar18].area = 1;
    r_00[uVar18].height = 1;
    good = uVar18;
    local_9c = iVar17;
    while (local_9c = local_9c + -1, n_idx = uVar18, -1 < local_9c) {
      piVar13[local_9c] = -1;
      piVar12[local_9c] = (uint)good / (uint)piVar14[local_9c];
      good = (uint)good % (uint)piVar14[local_9c];
    }
    do {
      temp_1 = 0;
      bVar15 = true;
      for (local_9c = 0; local_9c < iVar17 && bVar15; local_9c = local_9c + 1) {
        iVar19 = piVar13[local_9c] + piVar12[local_9c];
        local_552 = false;
        if (-1 < iVar19) {
          local_552 = iVar19 < piVar11[local_9c];
        }
        bVar15 = (bool)(local_552 & bVar15);
        temp_1 = iVar19 * piVar14[local_9c] + temp_1;
      }
      if (((bVar15) && (temp_1 != uVar18)) && (r_00[(uint)temp_1].parent != 0xffffffff)) {
        local_55c = r_00[n_idx].height;
        local_558 = r_00->height;
        n_idx = climb(r_00,uVar18);
        uVar16 = climb(r_00,temp_1);
        if (n_idx != uVar16) {
          uVar6 = im[uVar16];
          if ((uVar6 == uVar5) && ((int)local_55c < (int)local_558)) {
            r_00[n_idx].parent = uVar16;
            r_00[n_idx].shortcut = uVar16;
            r_00[uVar16].area = r_00[n_idx].area + r_00[uVar16].area;
            if ((int)local_558 <= (int)(local_55c + 1)) {
              local_558 = local_55c + 1;
            }
            r_00[uVar16].height = local_558;
            puVar10[nmer] = n_idx;
          }
          else {
            r_00[uVar16].parent = n_idx;
            r_00[uVar16].shortcut = n_idx;
            r_00[n_idx].area = r_00[uVar16].area + r_00[n_idx].area;
            if ((int)local_55c <= (int)(local_558 + 1)) {
              local_55c = local_558 + 1;
            }
            r_00[n_idx].height = local_55c;
            puVar10[nmer] = uVar16;
            if (uVar6 != uVar5) {
              nbig = nbig + 1;
            }
          }
          nmer = nmer + 1;
        }
      }
      local_9c = 0;
      while (iVar19 = piVar13[local_9c], piVar13[local_9c] = iVar19 + 1, 1 < iVar19 + 1) {
        iVar19 = local_9c + 1;
        piVar13[local_9c] = -1;
        local_9c = iVar19;
        if (iVar19 == iVar17) {
          k = k + 1;
          goto LAB_00103be5;
        }
      }
    } while( true );
  }
  iVar17 = nbig + 1;
  f->njoins = nmer;
  (f->stats).num_extremal = iVar17;
  if (f->rer < iVar17) {
    if ((MserExtrReg *)mer != (MserExtrReg *)0x0) {
      free(mer);
    }
    mer = (uint *)malloc((long)iVar17 * 0x1c);
    f->er = (MserExtrReg *)mer;
    f->rer = iVar17;
  }
  f->nmer = iVar17;
  nbig = 0;
  if (mer != (uint *)0x0) {
    for (k = 0; k < (int)uVar7; k = k + 1) {
      uVar18 = puVar9[k];
      if (im[uVar18] < im[r_00[uVar18].parent] || uVar18 == r_00[uVar18].parent) {
        mer[(long)nbig * 7 + 1] = uVar18;
        mer[(long)nbig * 7] = nbig;
        *(uchar *)(mer + (long)nbig * 7 + 2) = im[uVar18];
        mer[(long)nbig * 7 + 4] = r_00[uVar18].area;
        r_00[uVar18].shortcut = nbig;
        nbig = nbig + 1;
      }
      else {
        r_00[uVar18].shortcut = 0xffffffff;
      }
    }
  }
  for (k = 0; k < nbig; k = k + 1) {
    top = mer[(long)k * 7 + 1];
    do {
      top = r_00[(uint)top].parent;
    } while (r_00[(uint)top].shortcut == 0xffffffff);
    mer[(long)k * 7] = r_00[(uint)top].shortcut;
    mer[(long)k * 7 + 3] = k;
  }
  for (k = 0; k < nbig; k = k + 1) {
    uVar18 = mer[(long)k * 7 + 3];
    do {
      next_val = uVar18;
      uVar18 = mer[(long)next_val * 7];
      if (uVar18 == next_val) break;
    } while ((int)(uint)(byte)mer[(long)(int)uVar18 * 7 + 2] <=
             (int)((uint)(byte)mer[(long)k * 7 + 2] + iVar8));
    mer[(long)k * 7 + 5] =
         (uint)((float)(int)(mer[(long)next_val * 7 + 4] - mer[(long)k * 7 + 4]) /
               (float)(int)mer[(long)k * 7 + 4]);
    mer[(long)k * 7 + 6] = 1;
    local_564 = mer[(long)(int)mer[(long)k * 7] * 7 + 3];
    if ((int)local_564 < next_val) {
      local_564 = next_val;
    }
    mer[(long)(int)mer[(long)k * 7] * 7 + 3] = local_564;
  }
  nsmall = nbig;
  for (k = 0; k < nbig; k = k + 1) {
    min_area = (float)mer[(long)k * 7];
    if ((uint)(byte)mer[(ulong)(uint)min_area * 7 + 2] <= (byte)mer[(long)k * 7 + 2] + 1) {
      if ((float)mer[(ulong)(uint)min_area * 7 + 5] <= (float)mer[(long)k * 7 + 5]) {
        min_area = (float)k;
      }
      if (mer[(ulong)(uint)min_area * 7 + 6] != 0) {
        nsmall = nsmall + -1;
        mer[(ulong)(uint)min_area * 7 + 6] = 0;
      }
    }
  }
  (f->stats).num_unstable = nbig - nsmall;
  fVar1 = f->max_area;
  fVar2 = f->min_area;
  fVar3 = f->max_variation;
  fVar4 = f->min_diversity;
  k = nbig;
  while( true ) {
    do {
      k = k + -1;
      if (k < 0) {
        (f->stats).num_abs_unstable = i;
        (f->stats).num_too_big = nbad;
        (f->stats).num_too_small = ndup;
        (f->stats).num_duplicates = j;
        if (f->rmer < nsmall) {
          if (_njoins != (uint *)0x0) {
            free(_njoins);
          }
          _njoins = (uint *)malloc((long)nsmall << 2);
          f->mer = _njoins;
          f->rmer = nsmall;
        }
        f->nmer = nsmall;
        local_98 = 0;
        if ((mer != (uint *)0x0) && (_njoins != (uint *)0x0)) {
          for (k = 0; k < nbig; k = k + 1) {
            if (mer[(long)k * 7 + 6] != 0) {
              _njoins[local_98] = mer[(long)k * 7 + 1];
              local_98 = local_98 + 1;
            }
          }
        }
        return;
      }
    } while (mer[(long)k * 7 + 6] == 0);
    if (fVar3 <= (float)mer[(long)k * 7 + 5]) break;
    if (fVar1 * (float)uVar7 < (float)mer[(long)k * 7 + 4]) {
      nbad = nbad + 1;
      goto LAB_00104951;
    }
    if ((float)mer[(long)k * 7 + 4] < fVar2 * (float)uVar7) {
      ndup = ndup + 1;
      goto LAB_00104951;
    }
    if ((fVar4 < 1.0) && (uVar18 = mer[(long)k * 7], mer[(long)k * 7] != k)) {
      do {
        p_area = uVar18;
        if (mer[(ulong)(uint)p_area * 7 + 6] != 0) break;
        uVar18 = mer[(ulong)(uint)p_area * 7];
      } while (mer[(ulong)(uint)p_area * 7] != p_area);
      if ((float)(int)(mer[(ulong)(uint)p_area * 7 + 4] - mer[(long)k * 7 + 4]) /
          (float)(int)mer[(ulong)(uint)p_area * 7 + 4] < fVar4) {
        j = j + 1;
LAB_00104951:
        mer[(long)k * 7 + 6] = 0;
        nsmall = nsmall + -1;
      }
    }
  }
  i = i + 1;
  goto LAB_00104951;
}

Assistant:

void
mser_process(MserFilt *f, unsigned char const *im) {
    /* shortcuts */
    unsigned int nel = f->nel;
    unsigned int *perm = f->perm;
    unsigned int *joins = f->joins;
    int ndims = f->ndims;
    int *dims = f->dims;
    int *subs = f->subs;
    int *dsubs = f->dsubs;
    int *strides = f->strides;
    MserReg *r = f->r;
    MserExtrReg *er = f->er;
    unsigned int *mer = f->mer;
    int delta = f->delta;

    int njoins = 0;
    int ner = 0;
    int nmer = 0;
    int nbig = 0;
    int nsmall = 0;
    int nbad = 0;
    int ndup = 0;

    int i, j, k;

    /* delete any previosuly computed ellipsoid */
    f->nell = 0;


    /* -----------------------------------------------------------------
    *                                          Sort pixels by intensity
    * -------------------------------------------------------------- */

    {
        unsigned int buckets[MSER_PIX_MAXVAL];

        /* clear buckets */
        memset(buckets, 0, sizeof(unsigned int) * MSER_PIX_MAXVAL);


        /* compute bucket size (how many pixels for each intensity
        * value) */
        for (i = 0; i < (int) nel; ++i) {
            unsigned char v = im[i];
            ++buckets[v];
        }

        /* cumulatively add bucket sizes */
        for (i = 1; i < MSER_PIX_MAXVAL; ++i) {
            buckets[i] += buckets[i - 1];
        }

        /* empty buckets computing pixel ordering */
        for (i = nel; i >= 1;) {
            unsigned char v = im[--i];
            unsigned int j = --buckets[v];
            perm[j] = i;
        }
    }

    /* initialize the forest with all void nodes */
    for (i = 0; i < (int) nel; ++i) {
        r[i].parent = MSER_VOID_NODE;
    }


    /* -----------------------------------------------------------------
    *                        Compute regions and count extremal regions
    * -------------------------------------------------------------- */


    /*
    * In the following:
    * idx    : index of the current pixel
    * val    : intensity of the current pixel
    * r_idx  : index of the root of the current pixel
    * n_idx  : index of the neighbors of the current pixel
    * nr_idx : index of the root of the neighbor of the current pixel
    */

    /* process each pixel by increasing intensity */
    for (i = 0; i < (int) nel; ++i) {
        /* pop next node xi */
        unsigned int idx = perm[i];
        unsigned char val = im[idx];
        unsigned int r_idx;

        /* add the pixel to the forest as a root for now */
        r[idx].parent = idx;
        r[idx].shortcut = idx;
        r[idx].area = 1;
        r[idx].height = 1;

        r_idx = idx;


        /* convert the index IDX into the subscript SUBS; also initialize
        * DSUBS to (-1,-1,...,-1) */
        {
            unsigned int temp = idx;
            for (k = ndims - 1; k >= 0; --k) {
                dsubs[k] = -1;
                subs[k] = temp / strides[k];
                temp = temp % strides[k];
            }
        }

        /* examine the neighbors of the current pixel */
        while (1) {
            unsigned int n_idx = 0;
            int good = 1;


            /*
            * Compute the neighbor subscript as NSUBS+SUB, the
            * corresponding neighbor index NINDEX and check that the
            * neighbor is within the image domain.
            */
            for (k = 0; k < ndims && good; ++k) {
                int temp = dsubs[k] + subs[k];
                good &= (0 <= temp) && (temp < dims[k]);
                n_idx += temp * strides[k];
            }


            /*
            * The neighbor should be processed if the following conditions
            * are met:
            * 1. The neighbor is within image boundaries.
            * 2. The neighbor is indeed different from the current node
            * (the opposite happens when DSUB=(0,0,...,0)).
            * 3. The neighbor is already in the forest, meaning that it has
            * already been processed.
            */
            if (good &&
                n_idx != idx &&
                r[n_idx].parent != MSER_VOID_NODE) {
                unsigned char nr_val = 0;
                unsigned int nr_idx = 0;
                int hgt = r[r_idx].height;
                int n_hgt = r[nr_idx].height;


                /*
                * Now we join the two subtrees rooted at
                * R_IDX = ROOT(  IDX)
                * NR_IDX = ROOT(N_IDX).
                * Note that R_IDX = ROOT(IDX) might change as we process more
                * neighbors, so we need keep updating it.
                */

                r_idx = climb(r, idx);
                nr_idx = climb(r, n_idx);


                /*
                * At this point we have three possibilities:
                * (A) ROOT(IDX) == ROOT(NR_IDX). In this case the two trees
                * have already been joined and we do not do anything.
                * (B) I(ROOT(IDX)) == I(ROOT(NR_IDX)). In this case the pixel
                * IDX is extending an extremal region with the same
                * intensity value. Since ROOT(NR_IDX) will NOT be an
                * extremal region of the full image, ROOT(IDX) can be
                * safely added as children of ROOT(NR_IDX) if this
                * reduces the height according to the union rank
                * heuristic.
                * (C) I(ROOT(IDX)) > I(ROOT(NR_IDX)). In this case the pixel
                * IDX is starting a new extremal region. Thus ROOT(NR_IDX)
                * WILL be an extremal region of the final image and the
                * only possibility is to add ROOT(NR_IDX) as children of
                * ROOT(IDX), which becomes parent.
                */

                if (r_idx != nr_idx) /* skip if (A) */

                {
                    nr_val = im[nr_idx];

                    if (nr_val == val && hgt < n_hgt) {
                        /* ROOT(IDX) becomes the child */
                        r[r_idx].parent = nr_idx;
                        r[r_idx].shortcut = nr_idx;
                        r[nr_idx].area += r[r_idx].area;
                        r[nr_idx].height = MAX(n_hgt, hgt + 1);

                        joins[njoins++] = r_idx;
                    } else {
                        /* cases ROOT(IDX) becomes the parent */
                        r[nr_idx].parent = r_idx;
                        r[nr_idx].shortcut = r_idx;
                        r[r_idx].area += r[nr_idx].area;
                        r[r_idx].height = MAX(hgt, n_hgt + 1);

                        joins[njoins++] = nr_idx;

                        /* count if extremal */
                        if (nr_val != val)
                            ++ner;
                    }       /* check b vs c */
                }               /* check a vs b or c */
            }                       /* neighbor done */

            /* move to next neighbor */
            k = 0;
            while (++dsubs[k] > 1) {
                dsubs[k++] = -1;
                if (k == ndims)
                    goto done_all_neighbors;
            }
        } /* next neighbor */
        done_all_neighbors:;
    }        /* next pixel */

    /* the last root is extremal too */
    ++ner;

    /* save back */
    f->njoins = njoins;

    f->stats.num_extremal = ner;


    /* -----------------------------------------------------------------
    *                                          Extract extremal regions
    * -------------------------------------------------------------- */


    /*
    * Extremal regions are extracted and stored into the array ER.  The
    * structure R is also updated so that .SHORTCUT indexes the
    * corresponding extremal region if any (otherwise it is set to
    * VOID).
    */

    /* make room */
    if (f->rer < ner) {
        if (er)
            free(er);
        f->er = er = (MserExtrReg *) malloc(sizeof(MserExtrReg) * ner);
        f->rer = ner;
    };

    /* save back */
    f->nmer = ner;

    /* count again */
    ner = 0;

    /* scan all regions Xi */
    if (er != NULL) {
        for (i = 0; i < (int) nel; ++i) {
            /* pop next node xi */
            unsigned int idx = perm[i];

            unsigned char val = im[idx];
            unsigned int p_idx = r[idx].parent;
            unsigned char p_val = im[p_idx];

            /* is extremal ? */
            int is_extr = (p_val > val) || idx == p_idx;

            if (is_extr) {
                /* if so, add it */
                er[ner].index = idx;
                er[ner].parent = ner;
                er[ner].value = im[idx];
                er[ner].area = r[idx].area;

                /* link this region to this extremal region */
                r[idx].shortcut = ner;

                /* increase count */
                ++ner;
            } else {
                /* link this region to void */
                r[idx].shortcut = MSER_VOID_NODE;
            }
        }
    }


    /* -----------------------------------------------------------------
    *                                   Link extremal regions in a tree
    * -------------------------------------------------------------- */

    for (i = 0; i < ner; ++i) {
        unsigned int idx = er[i].index;

        do {
            idx = r[idx].parent;
        } while (r[idx].shortcut == MSER_VOID_NODE);

        er[i].parent = r[idx].shortcut;
        er[i].shortcut = i;
    }


    /* -----------------------------------------------------------------
    *                            Compute variability of +DELTA branches
    * -------------------------------------------------------------- */


    /* For each extremal region Xi of value VAL we look for the biggest
    * parent that has value not greater than VAL+DELTA. This is dubbed
    * `top parent'. */

    for (i = 0; i < ner; ++i) {
        /* Xj is the current region the region and Xj are the parents */
        int top_val = er[i].value + delta;
        int top = er[i].shortcut;

        /* examine all parents */
        while (1) {
            int next = er[top].parent;
            int next_val = er[next].value;


            /* Break if:
            * - there is no node above the top or
            * - the next node is above the top value.
            */
            if (next == top || next_val > top_val)
                break;

            /* so next could be the top */
            top = next;
        }

        /* calculate branch variation */
        {
            int area = er[i].area;
            int area_top = er[top].area;
            er[i].variation = (float) (area_top - area) / area;
            er[i].max_stable = 1;
        }


        /* Optimization: since extremal regions are processed by
        * increasing intensity, all next extremal regions being processed
        * have value at least equal to the one of Xi. If any of them has
        * parent the parent of Xi (this comprises the parent itself), we
        * can safely skip most intermediate node along the branch and
        * skip directly to the top to start our search. */
        {
            int parent = er[i].parent;
            int curr = er[parent].shortcut;
            er[parent].shortcut = MAX(top, curr);
        }
    }


    /* -----------------------------------------------------------------
    *                                  Select maximally stable branches
    * -------------------------------------------------------------- */

    nmer = ner;
    for (i = 0; i < ner; ++i) {
        unsigned int parent = er[i].parent;
        unsigned char val = er[i].value;
        float var = er[i].variation;
        unsigned char p_val = er[parent].value;
        float p_var = er[parent].variation;
        unsigned int loser;


        /*
        * Notice that R_parent = R_{l+1} only if p_val = val + 1. If not,
        * this and the parent region coincide and there is nothing to do.
        */
        if (p_val > val + 1)
            continue;

        /* decide which one to keep and put that in loser */
        if (var < p_var)
            loser = parent;
        else loser = i;

        /* make loser NON maximally stable */
        if (er[loser].max_stable) {
            --nmer;
            er[loser].max_stable = 0;
        }
    }

    f->stats.num_unstable = ner - nmer;


    /* -----------------------------------------------------------------
    *                                                 Further filtering
    * -------------------------------------------------------------- */


    /* It is critical for correct duplicate detection to remove regions
    * from the bottom (smallest one first).                          */
    {
        float max_area = (float) f->max_area * nel;
        float min_area = (float) f->min_area * nel;
        float max_var = (float) f->max_variation;
        float min_div = (float) f->min_diversity;

        /* scan all extremal regions (intensity value order) */
        for (i = ner - 1; i >= 0L; --i) {
            /* process only maximally stable extremal regions */
            if (!er[i].max_stable)
                continue;

            if (er[i].variation >= max_var) {
                ++nbad;
                goto remove;
            }
            if (er[i].area > max_area) {
                ++nbig;
                goto remove;
            }
            if (er[i].area < min_area) {
                ++nsmall;
                goto remove;
            }


            /*
            * Remove duplicates
            */
            if (min_div < 1.0) {
                unsigned int parent = er[i].parent;
                int area, p_area;
                float div;

                /* check all but the root mser */
                if ((int) parent != i) {
                    /* search for the maximally stable parent region */
                    while (!er[parent].max_stable) {
                        unsigned int next = er[parent].parent;
                        if (next == parent)
                            break;
                        parent = next;
                    }


                    /* Compare with the parent region; if the current and parent
                    * regions are too similar, keep only the parent. */
                    area = er[i].area;
                    p_area = er[parent].area;
                    div = (float) (p_area - area) / (float) p_area;

                    if (div < min_div) {
                        ++ndup;
                        goto remove;
                    }
                } /* remove dups end */
            }
            continue;
            remove:
            er[i].max_stable = 0;
            --nmer;
        }         /* check next region */

        f->stats.num_abs_unstable = nbad;
        f->stats.num_too_big = nbig;
        f->stats.num_too_small = nsmall;
        f->stats.num_duplicates = ndup;
    }


    /* -----------------------------------------------------------------
    *                                                   Save the result
    * -------------------------------------------------------------- */

    /* make room */
    if (f->rmer < nmer) {
        if (mer)
            free(mer);
        f->mer = mer = (unsigned int *) malloc(sizeof(unsigned int) * nmer);
        f->rmer = nmer;
    }

    /* save back */
    f->nmer = nmer;

    j = 0;
    if (er != NULL && mer != NULL) {
        for (i = 0; i < ner; ++i) {
            if (er[i].max_stable)
                mer[j++] = er[i].index;
        }
    }
}